

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O3

int __thiscall
booster::locale::util::gregorian_calendar::get_diff
          (gregorian_calendar *this,period_mark p,int diff,gregorian_calendar *other)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar3;
  long *plVar2;
  
  if (diff == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (**(this->super_abstract_calendar)._vptr_abstract_calendar)();
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    (**(code **)(*plVar2 + 0x40))(plVar2,p,0,diff);
    uVar3 = (uint)(plVar2[2] < other->time_);
    if (0 < diff) {
      uVar3 = -(uint)(other->time_ < plVar2[2]);
    }
    iVar1 = uVar3 + diff;
    (**(code **)(*plVar2 + 0x70))(plVar2);
  }
  return iVar1;
}

Assistant:

int get_diff(period::marks::period_mark p,int diff,gregorian_calendar const *other) const
            {
                if(diff == 0)
                    return 0;
                std::unique_ptr<gregorian_calendar> self(clone());
                self->adjust_value(p,move,diff);
                if(diff > 0){
                    if(self->time_ > other->time_)
                        return diff - 1;
                    else
                        return diff;
                }
                else {
                    if(self->time_ < other->time_)
                        return diff + 1;
                    else
                        return diff;
                }
             }